

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool __thiscall
glslang::TProgram::mapIO(TProgram *this,TIoMapResolver *pResolver,TIoMapper *pIoMapper)

{
  byte bVar1;
  ulong uVar2;
  int local_3c;
  int s;
  TIoMapper defaultIOMapper;
  TIoMapper *ioMapper;
  TIoMapper *pIoMapper_local;
  TIoMapResolver *pResolver_local;
  TProgram *this_local;
  
  if ((this->linked & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    SetThreadPoolAllocator(this->pool);
    defaultIOMapper._vptr_TIoMapper = (_func_int **)0x0;
    TIoMapper::TIoMapper((TIoMapper *)&stack0xffffffffffffffc8);
    defaultIOMapper._vptr_TIoMapper = (_func_int **)pIoMapper;
    if (pIoMapper == (TIoMapper *)0x0) {
      defaultIOMapper._vptr_TIoMapper = (_func_int **)&stack0xffffffffffffffc8;
    }
    for (local_3c = 0; local_3c < 0xe; local_3c = local_3c + 1) {
      if ((this->intermediate[local_3c] != (TIntermediate *)0x0) &&
         (uVar2 = (**(code **)(*defaultIOMapper._vptr_TIoMapper + 0x10))
                            (defaultIOMapper._vptr_TIoMapper,local_3c,this->intermediate[local_3c],
                             this->infoSink,pResolver), (uVar2 & 1) == 0)) {
        this_local._7_1_ = false;
        goto LAB_004dfb22;
      }
    }
    bVar1 = (**(code **)(*defaultIOMapper._vptr_TIoMapper + 0x18))
                      (defaultIOMapper._vptr_TIoMapper,pResolver,this->infoSink);
    this_local._7_1_ = (bool)(bVar1 & 1);
LAB_004dfb22:
    TIoMapper::~TIoMapper((TIoMapper *)&stack0xffffffffffffffc8);
  }
  return this_local._7_1_;
}

Assistant:

bool TProgram::mapIO(TIoMapResolver* pResolver, TIoMapper* pIoMapper)
{
    if (! linked)
        return false;

    SetThreadPoolAllocator(pool);

    TIoMapper* ioMapper = nullptr;
    TIoMapper defaultIOMapper;
    if (pIoMapper == nullptr)
        ioMapper = &defaultIOMapper;
    else
        ioMapper = pIoMapper;
    for (int s = 0; s < EShLangCount; ++s) {
        if (intermediate[s]) {
            if (! ioMapper->addStage((EShLanguage)s, *intermediate[s], *infoSink, pResolver))
                return false;
        }
    }

    return ioMapper->doMap(pResolver, *infoSink);
}